

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O1

char * soplex::getColName<double>(SPxLPBase<double> *p_lp,int p_idx,NameSet *p_cnames,char *p_buf)

{
  Item *pIVar1;
  DataKey local_30;
  SPxColId local_28;
  
  if (p_cnames != (NameSet *)0x0) {
    local_30 = (p_lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[p_idx];
    SPxColId::SPxColId(&local_28,&local_30);
    pIVar1 = (p_cnames->set).theitem;
    if (-1 < pIVar1[local_28.super_DataKey.idx].info) {
      return p_cnames->mem + pIVar1[local_28.super_DataKey.idx].data;
    }
  }
  spxSnprintf(p_buf,0x10,"x%d",p_idx);
  return p_buf;
}

Assistant:

static const char* getColName(
   const SPxLPBase<R>& p_lp,
   int                    p_idx,
   const NameSet*         p_cnames,
   char*                  p_buf
)
{
   assert(p_buf != nullptr);
   assert(p_idx >= 0);
   assert(p_idx <  p_lp.nCols());

   if(p_cnames != nullptr)
   {
      DataKey key = p_lp.cId(p_idx);

      if(p_cnames->has(key))
         return (*p_cnames)[key];
   }

   spxSnprintf(p_buf, 16, "x%d", p_idx);

   return p_buf;
}